

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servrbf.cpp
# Opt level: O0

UObject * __thiscall
icu_63::ICUResourceBundleFactory::handleCreate
          (ICUResourceBundleFactory *this,Locale *loc,int32_t param_2,ICUService *param_3,
          UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  ICUResourceBundleFactory *this_00;
  size_t size;
  ICUResourceBundleFactory *local_90;
  char local_58 [4];
  int32_t length;
  char pkg [20];
  UErrorCode *status_local;
  ICUService *param_3_local;
  int32_t param_2_local;
  Locale *loc_local;
  ICUResourceBundleFactory *this_local;
  
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 == '\0') {
    this_local = (ICUResourceBundleFactory *)0x0;
  }
  else {
    size = 0;
    iVar2 = icu_63::UnicodeString::extract(&this->_bundleName,0,0x7fffffff,local_58,0x14,kInvariant)
    ;
    if (iVar2 < 0x14) {
      this_00 = (ICUResourceBundleFactory *)UMemory::operator_new((UMemory *)0x18,size);
      local_90 = (ICUResourceBundleFactory *)0x0;
      if (this_00 != (ICUResourceBundleFactory *)0x0) {
        ResourceBundle::ResourceBundle((ResourceBundle *)this_00,local_58,loc,status);
        local_90 = this_00;
      }
      this_local = local_90;
    }
    else {
      this_local = (ICUResourceBundleFactory *)0x0;
    }
  }
  return (UObject *)this_local;
}

Assistant:

UObject*
ICUResourceBundleFactory::handleCreate(const Locale& loc, int32_t /* kind */, const ICUService* /* service */, UErrorCode& status) const
{
    if (U_SUCCESS(status)) {
        // _bundleName is a package name
        // and should only contain invariant characters
                // ??? is it always true that the max length of the bundle name is 19?
                // who made this change? -- dlf
        char pkg[20];
        int32_t length;
        length=_bundleName.extract(0, INT32_MAX, pkg, (int32_t)sizeof(pkg), US_INV);
        if(length>=(int32_t)sizeof(pkg)) {
            return NULL;
        }
        return new ResourceBundle(pkg, loc, status);
    }
    return NULL;
}